

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::RALocalAllocator::allocBranch
          (RALocalAllocator *this,InstNode *node,RABlock *target,RABlock *cont)

{
  BaseNode *node_00;
  Error EVar1;
  RASharedAssignment *pRVar2;
  BaseNode *pBVar3;
  Operand *pOVar4;
  BaseCompiler *pBVar5;
  Label trampoline;
  Label savedTarget;
  
  (this->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
  if ((*(PhysToWorkMap **)(target + 200) != (PhysToWorkMap *)0x0) &&
     (EVar1 = switchToAssignment(this,*(PhysToWorkMap **)(target + 200),
                                 (ZoneBitVector *)(target + 0x78),
                                 SUB41((*(uint *)(target + 0xc) & 8) >> 3,0),true), EVar1 != 0)) {
    return EVar1;
  }
  EVar1 = allocInst(this,node);
  if (EVar1 == 0) {
    if ((ulong)*(uint *)(target + 0xb8) == 0xffffffff) {
      pRVar2 = (RASharedAssignment *)(target + 0xbc);
    }
    else {
      pRVar2 = ZoneVector<asmjit::v1_14::RASharedAssignment>::operator[]
                         ((ZoneVector<asmjit::v1_14::RASharedAssignment> *)(*(long *)target + 0xe8),
                          (ulong)*(uint *)(target + 0xb8));
    }
    EVar1 = spillScratchGpRegsBeforeEntry(this,pRVar2->_entryScratchGpRegs);
    if (EVar1 == 0) {
      if (*(long *)(target + 200) == 0) {
        EVar1 = BaseRAPass::setBlockEntryAssignment
                          (this->_pass,target,this->_block,&this->_curAssignment);
        if (EVar1 != 0) {
          return EVar1;
        }
      }
      else {
        node_00 = *(BaseNode **)this->_pass->_extraBlock;
        pBVar3 = BaseBuilder::setCursor(&this->_cc->super_BaseBuilder,node_00);
        RAAssignment::copyFrom(&this->_tmpAssignment,&this->_curAssignment);
        EVar1 = switchToAssignment(this,*(PhysToWorkMap **)(target + 200),
                                   (ZoneBitVector *)(target + 0x78),
                                   SUB41((*(uint *)(target + 0xc) & 8) >> 3,0),false);
        if (EVar1 != 0) {
          return EVar1;
        }
        pBVar5 = this->_cc;
        if ((pBVar5->super_BaseBuilder)._cursor != node_00) {
          pOVar4 = InstNode::op(node,(byte)node[0x12] - 1);
          if (((pOVar4->super_Operand_)._signature._bits & 7) != 5) {
            return 3;
          }
          (*(this->_cc->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&trampoline);
          (pOVar4->super_Operand_)._signature._bits =
               trampoline.super_Operand.super_Operand_._signature._bits;
          (pOVar4->super_Operand_)._baseId = trampoline.super_Operand.super_Operand_._baseId;
          (pOVar4->super_Operand_)._data[0] = trampoline.super_Operand.super_Operand_._data[0];
          (pOVar4->super_Operand_)._data[1] = trampoline.super_Operand.super_Operand_._data[1];
          node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
          EVar1 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
          if (EVar1 != 0) {
            return EVar1;
          }
          pBVar5 = this->_cc;
          (pBVar5->super_BaseBuilder)._cursor = node_00;
          (*(pBVar5->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])(pBVar5,&trampoline);
          pBVar5 = this->_cc;
        }
        (pBVar5->super_BaseBuilder)._cursor = pBVar3;
        RAAssignment::swap(&this->_curAssignment,&this->_tmpAssignment);
      }
      EVar1 = 0;
    }
  }
  return EVar1;
}

Assistant:

Error RALocalAllocator::allocBranch(InstNode* node, RABlock* target, RABlock* cont) noexcept {
  // TODO: This should be used to make the branch allocation better.
  DebugUtils::unused(cont);

  // The cursor must point to the previous instruction for a possible instruction insertion.
  _cc->_setCursor(node->prev());

  // Use TryMode of `switchToAssignment()` if possible.
  if (target->hasEntryAssignment()) {
    ASMJIT_PROPAGATE(switchToAssignment(target->entryPhysToWorkMap(), target->liveIn(), target->isAllocated(), true));
  }

  ASMJIT_PROPAGATE(allocInst(node));
  ASMJIT_PROPAGATE(spillRegsBeforeEntry(target));

  if (target->hasEntryAssignment()) {
    BaseNode* injectionPoint = _pass->extraBlock()->prev();
    BaseNode* prevCursor = _cc->setCursor(injectionPoint);

    _tmpAssignment.copyFrom(_curAssignment);
    ASMJIT_PROPAGATE(switchToAssignment(target->entryPhysToWorkMap(), target->liveIn(), target->isAllocated(), false));

    BaseNode* curCursor = _cc->cursor();
    if (curCursor != injectionPoint) {
      // Additional instructions emitted to switch from the current state to the `target` state. This means
      // that we have to move these instructions into an independent code block and patch the jump location.
      Operand& targetOp = node->op(node->opCount() - 1);
      if (ASMJIT_UNLIKELY(!targetOp.isLabel())) {
        return DebugUtils::errored(kErrorInvalidState);
      }

      Label trampoline = _cc->newLabel();
      Label savedTarget = targetOp.as<Label>();

      // Patch `target` to point to the `trampoline` we just created.
      targetOp = trampoline;

      // Clear a possible SHORT form as we have no clue now if the SHORT form would be encodable after patching
      // the target to `trampoline` (X86 specific).
      node->clearOptions(InstOptions::kShortForm);

      // Finalize the switch assignment sequence.
      ASMJIT_PROPAGATE(_pass->emitJump(savedTarget));
      _cc->_setCursor(injectionPoint);
      _cc->bind(trampoline);
    }

    _cc->_setCursor(prevCursor);
    _curAssignment.swap(_tmpAssignment);
  }
  else {
    ASMJIT_PROPAGATE(_pass->setBlockEntryAssignment(target, block(), _curAssignment));
  }

  return kErrorOk;
}